

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O1

char * uv_strerror(int err)

{
  char *pcVar1;
  
  if (err < -0x7d) {
    if (err < -0xfbc) {
      if (err == -0xfff) {
        return "end of file";
      }
      if (err == -0xffe) {
        return "unknown error";
      }
      if (err == -0xff0) {
        return "invalid Unicode character";
      }
    }
    else {
      switch(err) {
      case -0xbc6:
        return "resolved protocol is unknown";
      case -0xbc5:
        return "invalid value for hints";
      case -0xbc4:
        break;
      case -0xbc3:
        return "socket type not supported";
      case -0xbc2:
        return "service not available for socket type";
      case -0xbc1:
        return "argument buffer overflow";
      case -0xbc0:
        return "unknown node or service";
      case -0xbbf:
        return "no address";
      case -0xbbe:
        return "out of memory";
      case -0xbbd:
        return "ai_family not supported";
      case -0xbbc:
        return "permanent failure";
      case -0xbbb:
        return "request canceled";
      case -0xbba:
        return "bad ai_flags value";
      case -0xbb9:
        return "temporary failure";
      case -3000:
        goto switchD_0048ce2e_caseD_ffffff9f;
      default:
        if (err == -0xfbc) {
          return "inappropriate file type or format";
        }
      }
    }
  }
  else {
    switch(err) {
    case -0x7d:
      return "operation canceled";
    case -0x79:
      return "remote I/O error";
    case -0x72:
      return "connection already in progress";
    case -0x71:
      return "host is unreachable";
    case -0x70:
      return "host is down";
    case -0x6f:
      return "connection refused";
    case -0x6e:
      return "connection timed out";
    case -0x6c:
      return "cannot send after transport endpoint shutdown";
    case -0x6b:
      return "socket is not connected";
    case -0x6a:
      return "socket is already connected";
    case -0x69:
      return "no buffer space available";
    case -0x68:
      return "connection reset by peer";
    case -0x67:
      return "software caused connection abort";
    case -0x65:
      return "network is unreachable";
    case -100:
      return "network is down";
    case -99:
      return "address not available";
    case -0x62:
      return "address already in use";
    case -0x61:
switchD_0048ce2e_caseD_ffffff9f:
      return "address family not supported";
    case -0x5f:
      return "operation not supported on socket";
    case -0x5d:
      return "protocol not supported";
    case -0x5c:
      return "protocol not available";
    case -0x5b:
      return "protocol wrong type for socket";
    case -0x5a:
      return "message too long";
    case -0x59:
      return "destination address required";
    case -0x58:
      return "socket operation on non-socket";
    case -0x47:
      return "protocol error";
    case -0x40:
      return "machine is not on the network";
    case -0x28:
      return "too many symbolic links encountered";
    case -0x27:
      return "directory not empty";
    case -0x26:
      return "function not implemented";
    case -0x24:
      return "name too long";
    case -0x22:
      return "result too large";
    case -0x20:
      return "broken pipe";
    case -0x1f:
      return "too many links";
    case -0x1e:
      return "read-only file system";
    case -0x1d:
      return "invalid seek";
    case -0x1c:
      return "no space left on device";
    case -0x1b:
      return "file too large";
    case -0x1a:
      return "text file is busy";
    case -0x19:
      return "inappropriate ioctl for device";
    case -0x18:
      return "too many open files";
    case -0x17:
      return "file table overflow";
    case -0x16:
      return "invalid argument";
    case -0x15:
      return "illegal operation on a directory";
    case -0x14:
      return "not a directory";
    case -0x13:
      return "no such device";
    case -0x12:
      return "cross-device link not permitted";
    case -0x11:
      return "file already exists";
    case -0x10:
      return "resource busy or locked";
    case -0xe:
      return "bad address in system call argument";
    case -0xd:
      return "permission denied";
    case -0xc:
      return "not enough memory";
    case -0xb:
      return "resource temporarily unavailable";
    case -9:
      return "bad file descriptor";
    case -7:
      return "argument list too long";
    case -6:
      return "no such device or address";
    case -5:
      return "i/o error";
    case -4:
      return "interrupted system call";
    case -3:
      return "no such process";
    case -2:
      return "no such file or directory";
    case -1:
      return "operation not permitted";
    }
  }
  pcVar1 = uv__unknown_err_code(err);
  return pcVar1;
}

Assistant:

const char* uv_strerror(int err) {
  switch (err) {
    UV_ERRNO_MAP(UV_STRERROR_GEN)
  }
  return uv__unknown_err_code(err);
}